

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_sCAL_s(png_const_structrp png_ptr,png_const_inforp info_ptr,int *unit,png_charpp width,
              png_charpp height)

{
  png_charpp height_local;
  png_charpp width_local;
  int *unit_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
     ((info_ptr->valid & 0x4000) == 0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    *unit = (uint)info_ptr->scal_unit;
    *width = info_ptr->scal_s_width;
    *height = info_ptr->scal_s_height;
    png_ptr_local._4_4_ = 0x4000;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_sCAL_s(png_const_structrp png_ptr, png_const_inforp info_ptr,
    int *unit, png_charpp width, png_charpp height)
{
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_sCAL) != 0)
   {
      *unit = info_ptr->scal_unit;
      *width = info_ptr->scal_s_width;
      *height = info_ptr->scal_s_height;
      return (PNG_INFO_sCAL);
   }

   return(0);
}